

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_rand.c
# Opt level: O0

int evp_rand_nonce_locked(EVP_RAND_CTX *ctx,uchar *out,size_t outlen)

{
  uint uVar1;
  long lVar2;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  uint str;
  EVP_RAND_CTX *in_stack_00000058;
  uchar *in_stack_00000068;
  int in_stack_00000070;
  uint in_stack_00000074;
  size_t in_stack_00000078;
  uchar *in_stack_00000080;
  EVP_RAND_CTX *in_stack_00000088;
  size_t in_stack_000000a0;
  int local_4;
  
  uVar1 = evp_rand_strength_locked(in_stack_00000058);
  if (*(long *)(*in_RDI + 0x68) == 0) {
    local_4 = 0;
  }
  else {
    lVar2 = (**(code **)(*in_RDI + 0x68))(in_RDI[1],in_RSI,uVar1,in_RDX,in_RDX);
    if (lVar2 == 0) {
      local_4 = evp_rand_generate_locked
                          (in_stack_00000088,in_stack_00000080,in_stack_00000078,in_stack_00000074,
                           in_stack_00000070,in_stack_00000068,in_stack_000000a0);
    }
    else {
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int evp_rand_nonce_locked(EVP_RAND_CTX *ctx, unsigned char *out,
                                 size_t outlen)
{
    unsigned int str = evp_rand_strength_locked(ctx);

    if (ctx->meth->nonce == NULL)
        return 0;
    if (ctx->meth->nonce(ctx->algctx, out, str, outlen, outlen))
        return 1;
    return evp_rand_generate_locked(ctx, out, outlen, str, 0, NULL, 0);
}